

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void tb_cleanup_arm(uc_struct_conflict1 *uc)

{
  int x;
  long lVar1;
  
  if ((uc != (uc_struct_conflict1 *)0x0) && (uc->l1_map != (void **)0x0)) {
    x = uc->v_l2_levels;
    if (x < 1) {
      if (0 < uc->v_l1_size) {
        lVar1 = 0;
        do {
          if (uc->l1_map[lVar1] != (gpointer)0x0) {
            g_free(uc->l1_map[lVar1]);
            uc->l1_map[lVar1] = (void *)0x0;
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 < uc->v_l1_size);
      }
    }
    else if (0 < uc->v_l1_size) {
      lVar1 = 0;
      do {
        if ((void **)uc->l1_map[lVar1] != (void **)0x0) {
          tb_clean_internal((void **)uc->l1_map[lVar1],x);
          uc->l1_map[lVar1] = (void *)0x0;
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < uc->v_l1_size);
    }
  }
  return;
}

Assistant:

void tb_cleanup(struct uc_struct *uc)
{
    int i, x;
    void **p;

    if (uc) {
        if (uc->l1_map) {
            x = uc->v_l2_levels;
            if (x <= 0) {
                for (i = 0; i < uc->v_l1_size; i++) {
                    p = uc->l1_map[i];
                    if (p) {
                        g_free(p);
                        uc->l1_map[i] = NULL;
                    }
                }
            } else {
                for (i = 0; i < uc->v_l1_size; i++) {
                    p = uc->l1_map[i];
                    if (p) {
                        tb_clean_internal(p, x);
                        uc->l1_map[i] = NULL;
                    }
                }
            }
        }
    }
}